

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b0762::Utf8Test_BytesFieldDoesntValidate_Test::
~Utf8Test_BytesFieldDoesntValidate_Test(Utf8Test_BytesFieldDoesntValidate_Test *this)

{
  Utf8Test_BytesFieldDoesntValidate_Test *this_local;
  
  ~Utf8Test_BytesFieldDoesntValidate_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Utf8Test, BytesFieldDoesntValidate) {
  upb::Arena arena;
  size_t size;
  char* data = GetBadUtf8Payload(arena.ptr(), &size);
  upb_test_TestUtf8Bytes* msg2 =
      upb_test_TestUtf8Bytes_parse(data, size, arena.ptr());

  // Parse succeeds, because the bytes field does not validate UTF-8.
  ASSERT_TRUE(msg2 != nullptr);
}